

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O3

void __thiscall
pass_test_merge_wire_assignment_block_Test::~pass_test_merge_wire_assignment_block_Test
          (pass_test_merge_wire_assignment_block_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(pass, test_merge_wire_assignment_block) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto &a = mod.var("a", 4);
    auto &b = mod.var("b", 4);

    auto comb = mod.combinational();
    for (auto i = 0; i < 4; i++) {
        comb->add_stmt(a[i].assign(b[i]));
    }

    fix_assignment_type(&mod);
    merge_wire_assignments(&mod);
    EXPECT_EQ(comb->size(), 1);
}